

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

bool __thiscall
helics::CommonCore::enterInitializingMode
          (CommonCore *this,LocalFederateId federateID,IterationRequest request)

{
  FederateStates FVar1;
  IterationResult IVar2;
  int iVar3;
  FederateState *this_00;
  InvalidFunctionCall *this_01;
  HelicsException *this_02;
  char *pcVar4;
  IterationRequest iterate;
  size_t sVar5;
  pointer_____offset_0x10___ *ppuVar6;
  bool bVar7;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view errorString;
  ActionMessage init;
  ActionMessage AStack_d8;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid for Entering Init";
    message._M_len = 0x26;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar6 = &InvalidIdentifier::typeinfo;
  }
  else {
    iVar3 = (int)(char)request;
    if (iVar3 - 1U < 2) {
      iterate = NO_ITERATIONS;
      if (this_00->mCallbackBased == false) {
        iterate = request;
      }
    }
    else {
      if (iVar3 == 7) {
        errorString._M_str = "error condition called in enterInitializingMode";
        errorString._M_len = 0x2f;
        localError(this,federateID,0x22,errorString);
        return false;
      }
      iterate = request;
      if (iVar3 == 3) {
        finalize(this,federateID);
        return false;
      }
    }
    FVar1 = FederateState::getState(this_00);
    if (FVar1 == CREATED) {
      LOCK();
      bVar7 = (this_00->initRequested)._M_base._M_i == false;
      if (bVar7) {
        (this_00->initRequested)._M_base._M_i = true;
      }
      UNLOCK();
      if (bVar7) {
        ActionMessage::ActionMessage(&AStack_d8,cmd_init);
        AStack_d8.source_id.gid = (this_00->global_id)._M_i.gid;
        if (iterate != NO_ITERATIONS) {
          setIterationFlags(&AStack_d8,iterate);
          LOCK();
          (this_00->initIterating)._M_base._M_i = true;
          UNLOCK();
          LOCK();
          (this->initIterations)._M_base._M_i = true;
          UNLOCK();
        }
        BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_d8);
        bVar7 = this_00->mCallbackBased;
        if (bVar7 == false) {
          IVar2 = FederateState::enterInitializingMode(this_00,iterate);
          LOCK();
          (this_00->initRequested)._M_base._M_i = false;
          UNLOCK();
          if ((IVar2 != NEXT_STEP) && (IVar2 != ITERATING)) {
            if (IVar2 == HALTED) {
              this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
              message_06._M_str = "HELICS system failure";
              message_06._M_len = 0x15;
              HelicsException::HelicsException(this_02,message_06);
              *(undefined ***)this_02 = &PTR__HelicsException_00570660;
              ppuVar6 = &HelicsSystemFailure::typeinfo;
            }
            else {
              if (this_00->errorCode == 0) goto LAB_002f671a;
              switch(this_00->errorCode) {
              case -10:
              case -9:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_00._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_00._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_00);
                *(undefined ***)this_02 = &PTR__HelicsException_00560f00;
                ppuVar6 = &InvalidFunctionCall::typeinfo;
                break;
              default:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_07._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_07._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_07);
                ppuVar6 = &HelicsException::typeinfo;
                break;
              case -4:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_02._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_02._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_02);
                *(undefined ***)this_02 = &PTR__HelicsException_00560f50;
                ppuVar6 = &InvalidParameter::typeinfo;
                break;
              case -3:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_03._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_03._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_03);
                *(undefined ***)this_02 = &PTR__HelicsException_00565588;
                ppuVar6 = &InvalidIdentifier::typeinfo;
                break;
              case -2:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_05._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_05._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_05);
                *(undefined ***)this_02 = &PTR__HelicsException_005656e8;
                ppuVar6 = &ConnectionFailure::typeinfo;
                break;
              case -1:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_04._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_04._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_04);
                *(undefined ***)this_02 = &PTR__HelicsException_00560eb0;
                ppuVar6 = &RegistrationFailure::typeinfo;
              }
            }
            __cxa_throw(this_02,ppuVar6,HelicsException::~HelicsException);
          }
        }
LAB_002f671a:
        ActionMessage::~ActionMessage(&AStack_d8);
        return (bool)(bVar7 ^ 1);
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "federate already has requested entry to initializing State";
      sVar5 = 0x3a;
    }
    else {
      if ((FVar1 == INITIALIZING) && (iterate == NO_ITERATIONS)) {
        return false;
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar4 = "May only enter initializing state from created state";
      sVar5 = 0x34;
    }
    message_01._M_str = pcVar4;
    message_01._M_len = sVar5;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_01);
    ppuVar6 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,HelicsException::~HelicsException);
}

Assistant:

bool CommonCore::enterInitializingMode(LocalFederateId federateID, IterationRequest request)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid for Entering Init"));
    }
    switch (request) {
        case IterationRequest::HALT_OPERATIONS:
            return finalize(federateID), false;
        case IterationRequest::ERROR_CONDITION:
            return localError(federateID, 34, "error condition called in enterInitializingMode"),
                   false;
        case IterationRequest::FORCE_ITERATION:
        case IterationRequest::ITERATE_IF_NEEDED:
            if (fed->isCallbackFederate()) {
                // callback federates cannot iterate in startup
                request = IterationRequest::NO_ITERATIONS;
            }
            break;
        default:
            break;
    }
    switch (fed->getState()) {
        case FederateStates::CREATED:
            break;
        case FederateStates::INITIALIZING:
            if (request == IterationRequest::NO_ITERATIONS) {
                return false;
            }
            [[fallthrough]];
        default:
            throw(InvalidFunctionCall("May only enter initializing state from created state"));
    }

    bool exp = false;
    // only enter this loop once per federate
    if (fed->initRequested.compare_exchange_strong(exp, true)) {
        ActionMessage init(CMD_INIT);
        init.source_id = fed->global_id.load();
        if (request != IterationRequest::NO_ITERATIONS) {
            setIterationFlags(init, request);
            fed->initIterating.store(true);
            initIterations.store(true);
        }

        addActionMessage(init);

        if (fed->isCallbackFederate()) {
            return false;
        }
        auto check = fed->enterInitializingMode(request);
        fed->initRequested = false;
        switch (check) {
            case IterationResult::NEXT_STEP:
            case IterationResult::ITERATING:
                break;
            case IterationResult::HALTED:
                throw(HelicsSystemFailure());
            default:
                generateFederateException(fed);
                break;
        }

        return true;
    }
    throw(InvalidFunctionCall("federate already has requested entry to initializing State"));
}